

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EbmlMaster.cpp
# Opt level: O2

bool __thiscall libebml::EbmlMaster::ProcessMandatory(EbmlMaster *this)

{
  EbmlSemantic *pEVar1;
  EbmlElement *element;
  EbmlSemanticContext *pEVar2;
  ulong uVar3;
  uint uVar4;
  ulong uVar5;
  
  pEVar2 = this->Context;
  uVar3 = pEVar2->Size;
  if (uVar3 != 0) {
    for (uVar4 = 0; uVar5 = (ulong)uVar4, uVar5 < uVar3; uVar4 = uVar4 + 1) {
      pEVar1 = pEVar2->MyTable;
      if ((pEVar1[uVar5].Mandatory == true) && (pEVar1[uVar5].Unique == true)) {
        element = (*(pEVar1[uVar5].GetCallbacks)->Create)();
        PushElement(this,element);
        pEVar2 = this->Context;
        uVar3 = pEVar2->Size;
      }
    }
  }
  return true;
}

Assistant:

bool EbmlMaster::ProcessMandatory()
{
  if (EBML_CTX_SIZE(Context) == 0)
  {
    return true;
  }

  assert(Context.GetSize() != 0);

  unsigned int EltIdx;
  for (EltIdx = 0; EltIdx < EBML_CTX_SIZE(Context); EltIdx++) {
    if (EBML_CTX_IDX(Context,EltIdx).IsMandatory() && EBML_CTX_IDX(Context,EltIdx).IsUnique()) {
//      assert(EBML_CTX_IDX(Context,EltIdx).Create != NULL);
            PushElement(EBML_SEM_CREATE(EBML_CTX_IDX(Context,EltIdx)));
    }
  }
  return true;
}